

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian.cpp
# Opt level: O1

void __thiscall amrex::MLNodeLaplacian::checkPoint(MLNodeLaplacian *this,string *file_name)

{
  pointer pcVar1;
  FabArray<amrex::FArrayBox> *mf;
  uint uVar2;
  uint uVar3;
  ostream *poVar4;
  undefined8 *puVar5;
  long *plVar6;
  ulong uVar7;
  ulong *puVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  uint uVar10;
  undefined8 uVar11;
  ulong uVar12;
  string HeaderFileName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  string __str_3;
  ofstream HeaderFile;
  string local_2a8;
  ulong *local_288;
  long local_280;
  ulong local_278 [2];
  ulong *local_268;
  long local_260;
  ulong local_258 [2];
  string *local_248;
  undefined8 local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_238;
  undefined1 local_230 [8];
  size_type local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  int aiStack_210 [54];
  ios_base local_138 [264];
  
  local_248 = file_name;
  if (*(int *)(DAT_00756620 + -0x3c) == *(int *)(DAT_00756620 + -0x30)) {
    UtilCreateCleanDirectory(file_name,false);
    pcVar1 = (file_name->_M_dataplus)._M_p;
    local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2a8,pcVar1,pcVar1 + file_name->_M_string_length);
    std::__cxx11::string::append((char *)&local_2a8);
    std::ofstream::ofstream(local_230);
    std::ofstream::open(local_230,(_Ios_Openmode)local_2a8._M_dataplus._M_p);
    if (*(int *)((long)aiStack_210 + *(size_type *)((long)local_230 + -0x18)) != 0) {
      FileOpenFailed(&local_2a8);
    }
    *(undefined8 *)((long)&local_228 + *(size_type *)((long)local_230 + -0x18)) = 0x11;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"verbose = ",10);
    poVar4 = (ostream *)
             std::ostream::operator<<(local_230,(this->super_MLNodeLinOp).super_MLLinOp.verbose);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"nlevs = ",8);
    poVar4 = (ostream *)
             std::ostream::operator<<
                       (poVar4,(this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"do_agglomeration = ",0x13);
    poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"do_consolidation = ",0x13);
    poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"agg_grid_size = ",0x10);
    poVar4 = (ostream *)
             std::ostream::operator<<
                       (poVar4,(this->super_MLNodeLinOp).super_MLLinOp.info.agg_grid_size);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"con_grid_size = ",0x10);
    poVar4 = (ostream *)
             std::ostream::operator<<
                       (poVar4,(this->super_MLNodeLinOp).super_MLLinOp.info.con_grid_size);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"has_metric_term = ",0x12);
    poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"max_coarsening_level = ",0x17);
    poVar4 = (ostream *)
             std::ostream::operator<<
                       (poVar4,(this->super_MLNodeLinOp).super_MLLinOp.info.max_coarsening_level);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"lobc = ",7);
    poVar4 = (ostream *)
             std::ostream::operator<<
                       (local_230,
                        ((this->super_MLNodeLinOp).super_MLLinOp.m_lobc.
                         super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                         .
                         super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    poVar4 = (ostream *)
             std::ostream::operator<<
                       (poVar4,((this->super_MLNodeLinOp).super_MLLinOp.m_lobc.
                                super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                                .
                                super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_elems[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    poVar4 = (ostream *)
             std::ostream::operator<<
                       (poVar4,((this->super_MLNodeLinOp).super_MLLinOp.m_lobc.
                                super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                                .
                                super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_elems[2]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"hibc = ",7);
    poVar4 = (ostream *)
             std::ostream::operator<<
                       (local_230,
                        ((this->super_MLNodeLinOp).super_MLLinOp.m_hibc.
                         super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                         .
                         super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    poVar4 = (ostream *)
             std::ostream::operator<<
                       (poVar4,((this->super_MLNodeLinOp).super_MLLinOp.m_hibc.
                                super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                                .
                                super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_elems[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    poVar4 = (ostream *)
             std::ostream::operator<<
                       (poVar4,((this->super_MLNodeLinOp).super_MLLinOp.m_hibc.
                                super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                                .
                                super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_elems[2]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"maxorder = ",0xb);
    poVar4 = (ostream *)
             std::ostream::operator<<(local_230,(this->super_MLNodeLinOp).super_MLLinOp.maxorder);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"is_rz = ",8);
    poVar4 = (ostream *)std::ostream::operator<<(local_230,this->m_is_rz);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"m_const_sigma = ",0x10)
    ;
    poVar4 = std::ostream::_M_insert<double>(this->m_const_sigma);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_230,"use_gauss_seidel = ",0x13);
    poVar4 = std::ostream::_M_insert<bool>(SUB81(local_230,0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_230,"use_harmonic_average = ",0x17);
    poVar4 = std::ostream::_M_insert<bool>(SUB81(local_230,0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_230,"coarsen_strategy = ",0x13);
    poVar4 = (ostream *)
             std::ostream::operator<<(local_230,(this->super_MLNodeLinOp).m_coarsening_strategy);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    local_230 = (undefined1  [8])_VTT;
    local_238 = _VTT;
    local_240 = __M_insert<void_const*>;
    *(undefined8 *)(local_230 + *(size_type *)(_VTT->_M_local_buf + -0x18)) =
         __M_insert<void_const*>;
    std::filebuf::~filebuf((filebuf *)&local_228);
    std::ios_base::~ios_base(local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    if (0 < (this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels) {
      uVar12 = 0;
      do {
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
        pcVar1 = (local_248->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2a8,pcVar1,pcVar1 + local_248->_M_string_length);
        std::__cxx11::string::append((char *)&local_2a8);
        uVar10 = 1;
        if (9 < uVar12) {
          uVar2 = 4;
          uVar7 = uVar12;
          do {
            uVar10 = uVar2;
            uVar3 = (uint)uVar7;
            if (uVar3 < 100) {
              uVar10 = uVar10 - 2;
              goto LAB_005a8f1d;
            }
            if (uVar3 < 1000) {
              uVar10 = uVar10 - 1;
              goto LAB_005a8f1d;
            }
            if (uVar3 < 10000) goto LAB_005a8f1d;
            uVar7 = (uVar7 & 0xffffffff) / 10000;
            uVar2 = uVar10 + 4;
          } while (99999 < uVar3);
          uVar10 = uVar10 + 1;
        }
LAB_005a8f1d:
        local_288 = local_278;
        std::__cxx11::string::_M_construct((ulong)&local_288,(char)uVar10);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_288,uVar10,(uint)uVar12);
        uVar11 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          uVar11 = local_2a8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar11 < local_280 + local_2a8._M_string_length) {
          uVar7 = 0xf;
          if (local_288 != local_278) {
            uVar7 = local_278[0];
          }
          if (uVar7 < local_280 + local_2a8._M_string_length) goto LAB_005a8f95;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_288,0,(char *)0x0,(ulong)local_2a8._M_dataplus._M_p);
        }
        else {
LAB_005a8f95:
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_2a8,(ulong)local_288);
        }
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(puVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar5 == paVar9) {
          local_220._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_220._8_8_ = puVar5[3];
          local_230 = (undefined1  [8])&local_220;
        }
        else {
          local_220._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_230 = (undefined1  [8])*puVar5;
        }
        local_228 = puVar5[1];
        *puVar5 = paVar9;
        puVar5[1] = 0;
        paVar9->_M_local_buf[0] = '\0';
        UtilCreateCleanDirectory((string *)local_230,false);
        if (local_230 != (undefined1  [8])&local_220) {
          operator_delete((void *)local_230,local_220._M_allocated_capacity + 1);
        }
        if (local_288 != local_278) {
          operator_delete(local_288,local_278[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
        }
        local_288 = local_278;
        pcVar1 = (local_248->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_288,pcVar1,pcVar1 + local_248->_M_string_length);
        std::__cxx11::string::append((char *)&local_288);
        uVar10 = 1;
        if (9 < uVar12) {
          uVar2 = 4;
          uVar7 = uVar12;
          do {
            uVar10 = uVar2;
            uVar3 = (uint)uVar7;
            if (uVar3 < 100) {
              uVar10 = uVar10 - 2;
              goto LAB_005a90cf;
            }
            if (uVar3 < 1000) {
              uVar10 = uVar10 - 1;
              goto LAB_005a90cf;
            }
            if (uVar3 < 10000) goto LAB_005a90cf;
            uVar7 = (uVar7 & 0xffffffff) / 10000;
            uVar2 = uVar10 + 4;
          } while (99999 < uVar3);
          uVar10 = uVar10 + 1;
        }
LAB_005a90cf:
        local_268 = local_258;
        std::__cxx11::string::_M_construct((ulong)&local_268,(char)uVar10);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_268,uVar10,(uint)uVar12);
        uVar7 = 0xf;
        if (local_288 != local_278) {
          uVar7 = local_278[0];
        }
        if (uVar7 < (ulong)(local_260 + local_280)) {
          uVar7 = 0xf;
          if (local_268 != local_258) {
            uVar7 = local_258[0];
          }
          if (uVar7 < (ulong)(local_260 + local_280)) goto LAB_005a9145;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_268,0,(char *)0x0,(ulong)local_288);
        }
        else {
LAB_005a9145:
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_288,(ulong)local_268);
        }
        local_230 = (undefined1  [8])&local_220;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(puVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar5 == paVar9) {
          local_220._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_220._8_8_ = puVar5[3];
        }
        else {
          local_220._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_230 = (undefined1  [8])*puVar5;
        }
        local_228 = puVar5[1];
        *puVar5 = paVar9;
        puVar5[1] = 0;
        paVar9->_M_local_buf[0] = '\0';
        puVar5 = (undefined8 *)std::__cxx11::string::append((char *)local_230);
        puVar8 = puVar5 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar8) {
          local_2a8.field_2._M_allocated_capacity = *puVar8;
          local_2a8.field_2._8_8_ = puVar5[3];
          local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
        }
        else {
          local_2a8.field_2._M_allocated_capacity = *puVar8;
          local_2a8._M_dataplus._M_p = (pointer)*puVar5;
        }
        local_2a8._M_string_length = puVar5[1];
        *puVar5 = puVar8;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        if (local_230 != (undefined1  [8])&local_220) {
          operator_delete((void *)local_230,local_220._M_allocated_capacity + 1);
        }
        if (local_268 != local_258) {
          operator_delete(local_268,local_258[0] + 1);
        }
        if (local_288 != local_278) {
          operator_delete(local_288,local_278[0] + 1);
        }
        std::ofstream::ofstream((string *)local_230);
        std::ofstream::open((char *)local_230,(_Ios_Openmode)local_2a8._M_dataplus._M_p);
        if (*(int *)((long)aiStack_210 + *(long *)((long)local_230 + -0x18)) != 0) {
          FileOpenFailed(&local_2a8);
        }
        *(undefined8 *)((long)&local_228 + *(long *)((long)local_230 + -0x18)) = 0x11;
        poVar4 = amrex::operator<<((ostream *)local_230,
                                   *(Geometry **)
                                    &(this->super_MLNodeLinOp).super_MLLinOp.m_geom.
                                     super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                     .
                                     super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar12].
                                     super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                     .
                                     super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                  );
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        BoxArray::writeOn(*(BoxArray **)
                           &(this->super_MLNodeLinOp).super_MLLinOp.m_grids.
                            super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                            .
                            super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar12].
                            super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                            super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,
                          (ostream *)local_230);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"\n",1);
        local_230 = (undefined1  [8])local_238;
        *(undefined8 *)(local_230 + *(size_type *)(local_238->_M_local_buf + -0x18)) = local_240;
        std::filebuf::~filebuf((filebuf *)&local_228);
        std::ios_base::~ios_base(local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
        }
        uVar12 = uVar12 + 1;
      } while ((long)uVar12 < (long)(this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels);
    }
  }
  if (0 < (this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels) {
    uVar12 = 0;
    do {
      mf = (FabArray<amrex::FArrayBox> *)
           **(undefined8 **)
             &(this->m_sigma).
              super_vector<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
              .
              super__Vector_base<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar12].
              super_vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
              .
              super__Vector_base<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
      ;
      if (mf != (FabArray<amrex::FArrayBox> *)0x0) {
        pcVar1 = (local_248->_M_dataplus)._M_p;
        local_288 = local_278;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_288,pcVar1,pcVar1 + local_248->_M_string_length);
        std::__cxx11::string::append((char *)&local_288);
        uVar10 = 1;
        if (9 < uVar12) {
          uVar2 = 4;
          uVar7 = uVar12;
          do {
            uVar10 = uVar2;
            uVar3 = (uint)uVar7;
            if (uVar3 < 100) {
              uVar10 = uVar10 - 2;
              goto LAB_005a9406;
            }
            if (uVar3 < 1000) {
              uVar10 = uVar10 - 1;
              goto LAB_005a9406;
            }
            if (uVar3 < 10000) goto LAB_005a9406;
            uVar7 = (uVar7 & 0xffffffff) / 10000;
            uVar2 = uVar10 + 4;
          } while (99999 < uVar3);
          uVar10 = uVar10 + 1;
        }
LAB_005a9406:
        local_268 = local_258;
        std::__cxx11::string::_M_construct((ulong)&local_268,(char)uVar10);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_268,uVar10,(uint)uVar12);
        uVar7 = 0xf;
        if (local_288 != local_278) {
          uVar7 = local_278[0];
        }
        if (uVar7 < (ulong)(local_260 + local_280)) {
          uVar7 = 0xf;
          if (local_268 != local_258) {
            uVar7 = local_258[0];
          }
          if (uVar7 < (ulong)(local_260 + local_280)) goto LAB_005a9475;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_268,0,(char *)0x0,(ulong)local_288);
        }
        else {
LAB_005a9475:
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_288,(ulong)local_268);
        }
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
        puVar8 = puVar5 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar8) {
          local_2a8.field_2._M_allocated_capacity = *puVar8;
          local_2a8.field_2._8_8_ = puVar5[3];
        }
        else {
          local_2a8.field_2._M_allocated_capacity = *puVar8;
          local_2a8._M_dataplus._M_p = (pointer)*puVar5;
        }
        local_2a8._M_string_length = puVar5[1];
        *puVar5 = puVar8;
        puVar5[1] = 0;
        *(undefined1 *)puVar8 = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_2a8);
        local_230 = (undefined1  [8])&local_220;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 == paVar9) {
          local_220._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_220._8_8_ = plVar6[3];
        }
        else {
          local_220._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_230 = (undefined1  [8])*plVar6;
        }
        local_228 = plVar6[1];
        *plVar6 = (long)paVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        VisMF::Write(mf,(string *)local_230,NFiles,false);
        if (local_230 != (undefined1  [8])&local_220) {
          operator_delete((void *)local_230,local_220._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
        }
        if (local_268 != local_258) {
          operator_delete(local_268,local_258[0] + 1);
        }
        if (local_288 != local_278) {
          operator_delete(local_288,local_278[0] + 1);
        }
      }
      uVar12 = uVar12 + 1;
    } while ((long)uVar12 < (long)(this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels);
  }
  return;
}

Assistant:

void
MLNodeLaplacian::checkPoint (std::string const& file_name) const
{
    if (ParallelContext::IOProcessorSub())
    {
        UtilCreateCleanDirectory(file_name, false);
        {
            std::string HeaderFileName(file_name+"/Header");
            std::ofstream HeaderFile;
            HeaderFile.open(HeaderFileName.c_str(), std::ofstream::out   |
                                                    std::ofstream::trunc |
                                                    std::ofstream::binary);
            if( ! HeaderFile.good()) {
                FileOpenFailed(HeaderFileName);
            }

            HeaderFile.precision(17);

            // MLLinop stuff
            HeaderFile << "verbose = " << verbose << "\n"
                       << "nlevs = " << NAMRLevels() << "\n"
                       << "do_agglomeration = " << info.do_agglomeration << "\n"
                       << "do_consolidation = " << info.do_consolidation << "\n"
                       << "agg_grid_size = " << info.agg_grid_size << "\n"
                       << "con_grid_size = " << info.con_grid_size << "\n"
                       << "has_metric_term = " << info.has_metric_term << "\n"
                       << "max_coarsening_level = " << info.max_coarsening_level << "\n";
#if (AMREX_SPACEDIM == 1)
            HeaderFile << "lobc = " << static_cast<int>(m_lobc[0][0]) << "\n";
#elif (AMREX_SPACEDIM == 2)
            HeaderFile << "lobc = " << static_cast<int>(m_lobc[0][0])
                       << " "       << static_cast<int>(m_lobc[0][1]) << "\n";
#else
            HeaderFile << "lobc = " << static_cast<int>(m_lobc[0][0])
                       << " "       << static_cast<int>(m_lobc[0][1])
                       << " "       << static_cast<int>(m_lobc[0][2]) << "\n";
#endif
#if (AMREX_SPACEDIM == 1)
            HeaderFile << "hibc = " << static_cast<int>(m_hibc[0][0]) << "\n";
#elif (AMREX_SPACEDIM == 2)
            HeaderFile << "hibc = " << static_cast<int>(m_hibc[0][0])
                       << " "       << static_cast<int>(m_hibc[0][1]) << "\n";
#else
            HeaderFile << "hibc = " << static_cast<int>(m_hibc[0][0])
                       << " "       << static_cast<int>(m_hibc[0][1])
                       << " "       << static_cast<int>(m_hibc[0][2]) << "\n";
#endif
            // m_coarse_data_for_bc: not used
            HeaderFile << "maxorder = " << getMaxOrder() << "\n";

            // MLNodeLaplacian stuff
            HeaderFile << "is_rz = " << m_is_rz << "\n";
            HeaderFile << "m_const_sigma = " << m_const_sigma << "\n";
            HeaderFile << "use_gauss_seidel = " << m_use_gauss_seidel << "\n";
            HeaderFile << "use_harmonic_average = " << m_use_harmonic_average << "\n";
            HeaderFile << "coarsen_strategy = " << static_cast<int>(m_coarsening_strategy) << "\n";
            // No level bc multifab
        }

        for (int ilev = 0; ilev < NAMRLevels(); ++ilev)
        {
            UtilCreateCleanDirectory(file_name+"/Level_"+std::to_string(ilev), false);
            std::string HeaderFileName(file_name+"/Level_"+std::to_string(ilev)+"/Header");
            std::ofstream HeaderFile;
            HeaderFile.open(HeaderFileName.c_str(), std::ofstream::out   |
                                                    std::ofstream::trunc |
                                                    std::ofstream::binary);
            if( ! HeaderFile.good()) {
                FileOpenFailed(HeaderFileName);
            }

            HeaderFile.precision(17);

            HeaderFile << Geom(ilev) << "\n";
            m_grids[ilev][0].writeOn(HeaderFile);  HeaderFile << "\n";
        }
    }

    ParallelContext::BarrierSub();

    for (int ilev = 0; ilev < NAMRLevels(); ++ilev)
    {
        if (m_sigma[ilev][0][0]) {
            VisMF::Write(*m_sigma[ilev][0][0], file_name+"/Level_"+std::to_string(ilev)+"/sigma");
        }
    }
}